

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O2

QPDFFileSpecObjectHelper * __thiscall
QPDFFileSpecObjectHelper::setFilename
          (QPDFFileSpecObjectHelper *this,string *unicode_name,string *compat_name)

{
  BaseHandle *pBVar1;
  QPDFObjectHandle uf;
  allocator<char> local_69;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_58 [16];
  string local_48;
  QPDFObjectHandle local_28;
  
  QPDFObjectHandle::newUnicodeString(&local_28,unicode_name);
  pBVar1 = &(this->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_58 + 0x10),"/UF",(allocator<char> *)local_58);
  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&local_68,(string *)(local_58 + 0x10),&local_28);
  std::__cxx11::string::~string((string *)(local_58 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  if (compat_name->_M_string_length == 0) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_58 + 0x10),"/F",(allocator<char> *)local_58);
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)&local_68,(string *)(local_58 + 0x10),&local_28);
  }
  else {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
    std::__cxx11::string::string<std::allocator<char>>((string *)(local_58 + 0x10),"/F",&local_69);
    QPDFObjectHandle::newString((string *)local_58);
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)&local_68,(string *)(local_58 + 0x10),
               (QPDFObjectHandle *)local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  }
  std::__cxx11::string::~string((string *)(local_58 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return this;
}

Assistant:

QPDFFileSpecObjectHelper&
QPDFFileSpecObjectHelper::setFilename(
    std::string const& unicode_name, std::string const& compat_name)
{
    auto uf = QPDFObjectHandle::newUnicodeString(unicode_name);
    oh().replaceKey("/UF", uf);
    if (compat_name.empty()) {
        QTC::TC("qpdf", "QPDFFileSpecObjectHelper empty compat_name");
        oh().replaceKey("/F", uf);
    } else {
        QTC::TC("qpdf", "QPDFFileSpecObjectHelper non-empty compat_name");
        oh().replaceKey("/F", QPDFObjectHandle::newString(compat_name));
    }
    return *this;
}